

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void av1_crc_calculator_init(CRC_CALCULATOR *p_crc_calculator,uint32_t bits,uint32_t truncPoly)

{
  uint32_t in_EDX;
  uint32_t in_ESI;
  CRC_CALCULATOR *in_RDI;
  
  in_RDI->remainder = 0;
  in_RDI->bits = in_ESI;
  in_RDI->trunc_poly = in_EDX;
  in_RDI->final_result_mask = (1 << ((byte)in_ESI & 0x1f)) - 1;
  crc_calculator_init_table(in_RDI);
  return;
}

Assistant:

void av1_crc_calculator_init(CRC_CALCULATOR *p_crc_calculator, uint32_t bits,
                             uint32_t truncPoly) {
  p_crc_calculator->remainder = 0;
  p_crc_calculator->bits = bits;
  p_crc_calculator->trunc_poly = truncPoly;
  p_crc_calculator->final_result_mask = (1 << bits) - 1;
  crc_calculator_init_table(p_crc_calculator);
}